

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall RPCCommandExecution::RPCCommandExecution(RPCCommandExecution *this,string *method)

{
  long lVar1;
  const_iterator __position;
  iterator iVar2;
  char *in_RSI;
  AnnotatedMixin<std::mutex> *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock9;
  RPCCommandExecutionInfo *in_stack_ffffffffffffff68;
  list<RPCCommandExecutionInfo,_std::allocator<RPCCommandExecutionInfo>_> *in_stack_ffffffffffffff70
  ;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff90;
  AnnotatedMixin<std::mutex> *mutexIn;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  mutexIn = in_RDI;
  std::_List_iterator<RPCCommandExecutionInfo>::_List_iterator
            ((_List_iterator<RPCCommandExecutionInfo> *)in_stack_ffffffffffffff68);
  MaybeCheckNotHeld((Mutex *)in_stack_ffffffffffffff68);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffffa8,mutexIn,in_RSI,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff8c,SUB41((uint)in_stack_ffffffffffffff88 >> 0x18,0));
  iVar2 = std::__cxx11::list<RPCCommandExecutionInfo,_std::allocator<RPCCommandExecutionInfo>_>::end
                    (in_stack_ffffffffffffff70);
  std::_List_const_iterator<RPCCommandExecutionInfo>::_List_const_iterator
            ((_List_const_iterator<RPCCommandExecutionInfo> *)in_stack_ffffffffffffff68,
             (iterator *)0x13f1345);
  std::__cxx11::string::string
            (in_stack_ffffffffffffffb0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iVar2._M_node);
  std::chrono::_V2::steady_clock::now();
  __position._M_node._4_4_ = in_stack_ffffffffffffff8c;
  __position._M_node._0_4_ = in_stack_ffffffffffffff88;
  iVar2 = std::__cxx11::list<RPCCommandExecutionInfo,_std::allocator<RPCCommandExecutionInfo>_>::
          insert(in_stack_ffffffffffffff70,__position,in_stack_ffffffffffffff68);
  (in_RDI->super_mutex).super___mutex_base._M_mutex.__align = (long)iVar2._M_node;
  RPCCommandExecutionInfo::~RPCCommandExecutionInfo(in_stack_ffffffffffffff68);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit RPCCommandExecution(const std::string& method)
    {
        LOCK(g_rpc_server_info.mutex);
        it = g_rpc_server_info.active_commands.insert(g_rpc_server_info.active_commands.end(), {method, SteadyClock::now()});
    }